

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
          (QPodArrayOps<_drmModeModeInfo> *this,qsizetype i,_drmModeModeInfo *args)

{
  bool bVar1;
  qsizetype qVar2;
  _drmModeModeInfo *p_Var3;
  void *in_RDX;
  QArrayDataPointer<_drmModeModeInfo> *in_RSI;
  QArrayDataPointer<_drmModeModeInfo> *in_RDI;
  long in_FS_OFFSET;
  _drmModeModeInfo *where;
  GrowthPosition pos;
  bool detach;
  _drmModeModeInfo tmp;
  QArrayDataPointer<_drmModeModeInfo> *in_stack_ffffffffffffff88;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar5;
  GrowthPosition where_00;
  undefined1 local_4c [68];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<_drmModeModeInfo>::needsDetach(in_RDI);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
  if (!bVar1) {
    if ((in_RSI == (QArrayDataPointer<_drmModeModeInfo> *)in_RDI->size) &&
       (qVar2 = QArrayDataPointer<_drmModeModeInfo>::freeSpaceAtEnd(in_stack_ffffffffffffff88),
       qVar2 != 0)) {
      p_Var3 = QArrayDataPointer<_drmModeModeInfo>::end(in_RDI);
      memcpy(p_Var3,in_RDX,0x44);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00121921;
    }
    if ((in_RSI == (QArrayDataPointer<_drmModeModeInfo> *)0x0) &&
       (qVar2 = QArrayDataPointer<_drmModeModeInfo>::freeSpaceAtBegin(in_stack_ffffffffffffff88),
       qVar2 != 0)) {
      p_Var3 = QArrayDataPointer<_drmModeModeInfo>::begin
                         ((QArrayDataPointer<_drmModeModeInfo> *)0x12184f);
      memcpy(p_Var3 + -1,in_RDX,0x44);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00121921;
    }
  }
  memset(local_4c,0xaa,0x44);
  memcpy(local_4c,in_RDX,0x44);
  where_00 = (GrowthPosition)((ulong)in_RDX >> 0x20);
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<_drmModeModeInfo> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<_drmModeModeInfo>::detachAndGrow
            (in_RSI,where_00,CONCAT44(uVar5,uVar4),(_drmModeModeInfo **)in_stack_ffffffffffffff88,
             in_RDI);
  p_Var3 = createHole((QPodArrayOps<_drmModeModeInfo> *)in_RSI,where_00,CONCAT44(uVar5,uVar4),
                      (qsizetype)in_stack_ffffffffffffff88);
  memcpy(p_Var3,local_4c,0x44);
LAB_00121921:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }